

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void glad_gl_free_extensions(char **exts_i,uint num_exts_i)

{
  uint local_18;
  uint index;
  uint num_exts_i_local;
  char **exts_i_local;
  
  if (exts_i != (char **)0x0) {
    for (local_18 = 0; local_18 < num_exts_i; local_18 = local_18 + 1) {
      free(exts_i[local_18]);
    }
    free(exts_i);
  }
  return;
}

Assistant:

static void glad_gl_free_extensions(char **exts_i, unsigned int num_exts_i) {
    if (exts_i != NULL) {
        unsigned int index;
        for(index = 0; index < num_exts_i; index++) {
            free((void *) (exts_i[index]));
        }
        free((void *)exts_i);
        exts_i = NULL;
    }
}